

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

void luaD_throw(lua_State *L,int errcode)

{
  global_State *pgVar1;
  StkId pTVar2;
  StkId pTVar3;
  undefined4 uVar4;
  TValue *io1;
  global_State *g;
  int errcode_local;
  lua_State *L_local;
  
  if (L->errorJmp != (lua_longjmp *)0x0) {
    L->errorJmp->status = errcode;
    longjmp((__jmp_buf_tag *)L->errorJmp->b,1);
  }
  pgVar1 = L->l_G;
  L->status = (lu_byte)errcode;
  if (pgVar1->mainthread->errorJmp != (lua_longjmp *)0x0) {
    pTVar2 = pgVar1->mainthread->top;
    pgVar1->mainthread->top = pTVar2 + 1;
    pTVar3 = L->top;
    pTVar2->value_ = pTVar3[-1].value_;
    uVar4 = *(undefined4 *)&pTVar3[-1].field_0xc;
    pTVar2->tt_ = pTVar3[-1].tt_;
    *(undefined4 *)&pTVar2->field_0xc = uVar4;
    luaD_throw(pgVar1->mainthread,errcode);
  }
  if (pgVar1->panic != (lua_CFunction)0x0) {
    seterrorobj(L,errcode,L->top);
    if (L->ci->top < L->top) {
      L->ci->top = L->top;
    }
    (*pgVar1->panic)(L);
  }
  abort();
}

Assistant:

l_noret luaD_throw(lua_State *L, int errcode) {
    if (L->errorJmp) {  /* thread has an error handler? */
        L->errorJmp->status = errcode;  /* set status */
        LUAI_THROW(L, L->errorJmp);  /* jump to it */
    } else {  /* thread has no error handler */
        global_State *g = G(L);
        L->status = cast_byte(errcode);  /* mark it as dead */
        if (g->mainthread->errorJmp) {  /* main thread has a handler? */
            setobjs2s(L, g->mainthread->top++, L->top - 1);  /* copy error obj. */
            luaD_throw(g->mainthread, errcode);  /* re-throw in main thread */
        } else {  /* no handler at all; abort */
            if (g->panic) {  /* panic function? */
                seterrorobj(L, errcode, L->top);  /* assume EXTRA_STACK */
                if (L->ci->top < L->top)
                    L->ci->top = L->top;  /* pushing msg. can break this invariant */
                lua_unlock(L);
                g->panic(L);  /* call panic function (last chance to jump out) */
            }
            abort();
        }
    }
}